

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

reg_desc_t * find_rd_by_reg(MIR_context_t ctx,MIR_reg_t reg,MIR_func_t func)

{
  long *plVar1;
  ulong *puVar2;
  size_t el;
  int iVar3;
  void *__ptr;
  ulong uVar4;
  ulong uVar5;
  ulong unaff_RBP;
  undefined4 in_register_00000034;
  VARR_reg_desc_t *varr;
  uint uVar6;
  MIR_func_t unaff_R14;
  size_t rdn;
  MIR_context_t local_58;
  size_t local_50;
  reg_desc_t local_48;
  
  varr = (VARR_reg_desc_t *)CONCAT44(in_register_00000034,reg);
  plVar1 = (long *)func->internal;
  puVar2 = (ulong *)*plVar1;
  if (puVar2 == (ulong *)0x0) {
LAB_00132db6:
    find_rd_by_reg_cold_3();
  }
  else {
    __ptr = (void *)puVar2[2];
    if (__ptr != (void *)0x0) {
      el = *puVar2;
      unaff_RBP = (ulong)reg;
      uVar5 = el + 1;
      uVar4 = el;
      if (puVar2[1] < uVar5) {
        uVar5 = (uVar5 >> 1) + uVar5;
        __ptr = realloc(__ptr,uVar5 * 0x18);
        puVar2[2] = (ulong)__ptr;
        puVar2[1] = uVar5;
        uVar5 = *puVar2 + 1;
        uVar4 = *puVar2;
      }
      *puVar2 = uVar5;
      *(undefined4 *)((long)__ptr + uVar4 * 0x18) = 6;
      *(MIR_reg_t *)((long)__ptr + uVar4 * 0x18 + 4) = reg;
      *(undefined8 *)((long)__ptr + uVar4 * 0x18 + 8) = 0;
      iVar3 = HTAB_size_t_do((HTAB_size_t *)plVar1[3],el,HTAB_FIND,&local_50);
      varr = (VARR_reg_desc_t *)*plVar1;
      local_58 = ctx;
      if (iVar3 == 0) goto LAB_00132dc0;
      if (((varr != (VARR_reg_desc_t *)0x0) && (varr->varr != (reg_desc_t *)0x0)) &&
         (varr->els_num != 0)) {
        varr->els_num = varr->els_num - 1;
        return varr->varr + local_50;
      }
      find_rd_by_reg_cold_1();
      unaff_R14 = func;
      goto LAB_00132db6;
    }
  }
  func = unaff_R14;
  find_rd_by_reg_cold_2();
LAB_00132dc0:
  VARR_reg_desc_tpop(&local_48,varr);
  uVar6 = 0xf;
  (*local_58->error_func)
            (MIR_undeclared_func_reg_error,"undeclared reg %u of func %s",unaff_RBP & 0xffffffff,
             func->name);
  if (0xd < uVar6) {
    return (reg_desc_t *)0x1ae6e3;
  }
  return (reg_desc_t *)(&DAT_001acb50 + *(int *)(&DAT_001acb50 + (ulong)uVar6 * 4));
}

Assistant:

static reg_desc_t *find_rd_by_reg (MIR_context_t ctx, MIR_reg_t reg, MIR_func_t func) {
  func_regs_t func_regs = func->internal;
  size_t rdn, temp_rdn;
  reg_desc_t rd;

  rd.reg = reg;
  rd.name = NULL;
  rd.type = MIR_T_I64; /* to eliminate warnings */
  temp_rdn = VARR_LENGTH (reg_desc_t, func_regs->reg_descs);
  VARR_PUSH (reg_desc_t, func_regs->reg_descs, rd);
  if (!HTAB_DO (size_t, func_regs->reg2rdn_tab, temp_rdn, HTAB_FIND, rdn)) {
    VARR_POP (reg_desc_t, func_regs->reg_descs);
    MIR_get_error_func (ctx) (MIR_undeclared_func_reg_error, "undeclared reg %u of func %s", reg,
                              func->name);
  }
  VARR_POP (reg_desc_t, func_regs->reg_descs);
  return &VARR_ADDR (reg_desc_t, func_regs->reg_descs)[rdn];
}